

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
xscript::parser::ast::parse_switch_label
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  token_t_conflict tVar1;
  bool bVar2;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  initializer_list<xscript::tokenizer::token_t> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_d0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  less<xscript::tokenizer::token_t> local_2a;
  allocator_type local_29;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,SWITCH_LABEL);
  tVar1 = (this->cur_token).type;
  if (tVar1 == TK_DEFAULT) {
    parse_token(this,parent_00);
  }
  else {
    if (tVar1 != TK_CASE) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"build_O3/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
      local_40._M_len = 0x1c;
      local_40._M_str = "\'case\' or \'default\' expected";
      args._M_len = 1;
      args._M_array = &local_40;
      append_syntax_error(this,&local_a0,0x4c6,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        return false;
      }
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      return false;
    }
    parse_token(this,parent_00);
    bVar2 = parse_expression(this,parent_00,0xf);
    if (!bVar2) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"build_O3/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
      local_40._M_len = CONCAT44(local_40._M_len._4_4_,0x36);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_40;
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::set((set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
             *)&local_d0,__l,&local_2a,&local_29);
      process_failover(this,&local_60,0x4c1,
                       (set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
                        *)&local_d0,false);
      std::
      _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::~_Rb_tree(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->cur_token).type == TK_COLON) {
    next(this);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"build_O3/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_40._M_len = 0xc;
    local_40._M_str = "\':\' expected";
    args_00._M_len = 1;
    args_00._M_array = &local_40;
    append_syntax_error(this,&local_80,0x4ca,args_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  do {
    tVar1 = (this->cur_token).type;
    if (tVar1 == TK_LEFT_BRACE) {
      bVar2 = parse_block(this,parent_00);
    }
    else {
      if (tVar1 - TK_CASE < 2) {
        return true;
      }
      if (tVar1 == TK_RIGHT_BRACE) {
        return true;
      }
      bVar2 = parse_block_statement(this,parent_00);
    }
    if (bVar2 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ast::parse_switch_label(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(SWITCH_LABEL);

    if (cur_token == tokenizer::TK_CASE) {
        parse_token(node);

        if (!parse_expression(node)) {
            failbefore({tokenizer::TK_COLON});
        }
    } else if (cur_token == tokenizer::TK_DEFAULT) {
        parse_token(node);
    } else {
        return syntax_error({"'case' or 'default' expected"});
    }

    if (cur_token != tokenizer::TK_COLON) {
        syntax_error({"':' expected"});
    } else {
        next();
    }

    while (cur_token != tokenizer::TK_CASE &&
        cur_token != tokenizer::TK_DEFAULT &&
        cur_token != tokenizer::TK_RIGHT_BRACE
    ) {
        if (cur_token == tokenizer::TK_LEFT_BRACE) {
            if (!parse_block(node)) {
                return false;
            }
        } else {
            if (!parse_block_statement(node)) {
                return false;
            }
        }
    }

    return true;
}